

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

void __thiscall mnf::Manifold::setTangentDimension(Manifold *this,Index td)

{
  undefined8 uVar1;
  
  if (((this->super_ValidManifold).flag_ == 0x677d7257) && (-1 < td)) {
    testLock(this);
    this->tangentDim_ = td;
    return;
  }
  uVar1 = __cxa_allocate_exception(1);
  __cxa_throw(uVar1,&mnf_exception::typeinfo,0);
}

Assistant:

Manifold::~Manifold() {}